

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O2

char * ngx_http_charset_map_block(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  long lVar1;
  ngx_int_t nVar2;
  ngx_int_t nVar3;
  ngx_int_t *pnVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  ngx_conf_t *pnVar9;
  undefined8 *puVar10;
  byte bVar11;
  undefined8 local_b8;
  ngx_conf_t pvcf;
  ngx_http_charset_conf_ctx_t ctx;
  
  bVar11 = 0;
  pvVar5 = cf->args->elts;
  nVar2 = ngx_http_add_charset((ngx_array_t *)conf,(ngx_str_t *)((long)pvVar5 + 0x10));
  if (nVar2 != -1) {
    nVar3 = ngx_http_add_charset((ngx_array_t *)conf,(ngx_str_t *)((long)pvVar5 + 0x20));
    if (nVar3 != -1) {
      if (nVar2 == nVar3) {
        pcVar6 = "\"charset_map\" between the same charsets \"%V\" and \"%V\"";
      }
      else {
        lVar7 = *(long *)((long)conf + 0x30) + 1;
        do {
          lVar7 = lVar7 + -1;
          if (lVar7 == 0) {
            pnVar4 = (ngx_int_t *)ngx_array_push((ngx_array_t *)((long)conf + 0x28));
            if (pnVar4 == (ngx_int_t *)0x0) {
              return (char *)0xffffffffffffffff;
            }
            *pnVar4 = nVar2;
            pnVar4[1] = nVar3;
            nVar2 = ngx_strcasecmp(*(u_char **)((long)pvVar5 + 0x28),(u_char *)"utf-8");
            if (nVar2 == 0) {
              pvVar5 = ngx_pcalloc(cf->pool,0x400);
              pnVar4[2] = (ngx_int_t)pvVar5;
              if (pvVar5 == (void *)0x0) {
                return (char *)0xffffffffffffffff;
              }
              pvVar5 = ngx_pcalloc(cf->pool,0x800);
              pnVar4[3] = (ngx_int_t)pvVar5;
              if (pvVar5 == (void *)0x0) {
                return (char *)0xffffffffffffffff;
              }
              pvVar5 = ngx_pcalloc(cf->pool,0x100);
              if (pvVar5 == (void *)0x0) {
                return (char *)0xffffffffffffffff;
              }
              *(void **)pnVar4[3] = pvVar5;
              for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 1) {
                lVar8 = pnVar4[2];
                *(undefined1 *)(lVar8 + lVar7 * 4) = 1;
                *(char *)(lVar8 + 1 + lVar7 * 4) = (char)lVar7;
                *(char *)((long)pvVar5 + lVar7) = (char)lVar7;
              }
              for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 1) {
                *(undefined2 *)(pnVar4[2] + 0x200 + lVar7 * 4) = 0x3f01;
              }
            }
            else {
              pvVar5 = ngx_palloc(cf->pool,0x100);
              pnVar4[2] = (ngx_int_t)pvVar5;
              if (pvVar5 == (void *)0x0) {
                return (char *)0xffffffffffffffff;
              }
              pvVar5 = ngx_palloc(cf->pool,0x100);
              pnVar4[3] = (ngx_int_t)pvVar5;
              if (pvVar5 == (void *)0x0) {
                return (char *)0xffffffffffffffff;
              }
              for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 1) {
                *(char *)(pnVar4[2] + lVar7) = (char)lVar7;
                *(char *)(pnVar4[3] + lVar7) = (char)lVar7;
              }
              for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 1) {
                *(undefined1 *)(pnVar4[2] + 0x80 + lVar7) = 0x3f;
                *(undefined1 *)(pnVar4[3] + 0x80 + lVar7) = 0x3f;
              }
            }
            lVar7 = 0xc;
            pnVar9 = cf;
            puVar10 = &local_b8;
            pvcf.handler_conf = (char *)pnVar4;
            for (lVar8 = lVar7; lVar8 != 0; lVar8 = lVar8 + -1) {
              *puVar10 = pnVar9->name;
              pnVar9 = (ngx_conf_t *)((long)pnVar9 + (ulong)bVar11 * -0x10 + 8);
              puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
            }
            cf->ctx = &pvcf.handler_conf;
            cf->handler = ngx_http_charset_map;
            cf->handler_conf = (char *)conf;
            pcVar6 = ngx_conf_parse(cf,(ngx_str_t *)0x0);
            puVar10 = &local_b8;
            for (; lVar7 != 0; lVar7 = lVar7 + -1) {
              cf->name = (char *)*puVar10;
              puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
              cf = (ngx_conf_t *)((long)cf + (ulong)bVar11 * -0x10 + 8);
            }
            return pcVar6;
          }
          lVar8 = **(long **)((long)conf + 0x28);
          lVar1 = (*(long **)((long)conf + 0x28))[1];
        } while ((nVar3 != lVar1 || nVar2 != lVar8) && (lVar8 != nVar3 || lVar1 != nVar2));
        pcVar6 = "duplicate \"charset_map\" between \"%V\" and \"%V\"";
      }
      ngx_conf_log_error(1,cf,0,pcVar6,(ngx_str_t *)((long)pvVar5 + 0x10),
                         (ngx_str_t *)((long)pvVar5 + 0x20));
    }
  }
  return (char *)0xffffffffffffffff;
}

Assistant:

static char *
ngx_http_charset_map_block(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_charset_main_conf_t  *mcf = conf;

    char                         *rv;
    u_char                       *p, *dst2src, **pp;
    ngx_int_t                     src, dst;
    ngx_uint_t                    i, n;
    ngx_str_t                    *value;
    ngx_conf_t                    pvcf;
    ngx_http_charset_t           *charset;
    ngx_http_charset_tables_t    *table;
    ngx_http_charset_conf_ctx_t   ctx;

    value = cf->args->elts;

    src = ngx_http_add_charset(&mcf->charsets, &value[1]);
    if (src == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    dst = ngx_http_add_charset(&mcf->charsets, &value[2]);
    if (dst == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    if (src == dst) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "\"charset_map\" between the same charsets "
                           "\"%V\" and \"%V\"", &value[1], &value[2]);
        return NGX_CONF_ERROR;
    }

    table = mcf->tables.elts;
    for (i = 0; i < mcf->tables.nelts; i++) {
        if ((src == table->src && dst == table->dst)
             || (src == table->dst && dst == table->src))
        {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "duplicate \"charset_map\" between "
                               "\"%V\" and \"%V\"", &value[1], &value[2]);
            return NGX_CONF_ERROR;
        }
    }

    table = ngx_array_push(&mcf->tables);
    if (table == NULL) {
        return NGX_CONF_ERROR;
    }

    table->src = src;
    table->dst = dst;

    if (ngx_strcasecmp(value[2].data, (u_char *) "utf-8") == 0) {
        table->src2dst = ngx_pcalloc(cf->pool, 256 * NGX_UTF_LEN);
        if (table->src2dst == NULL) {
            return NGX_CONF_ERROR;
        }

        table->dst2src = ngx_pcalloc(cf->pool, 256 * sizeof(void *));
        if (table->dst2src == NULL) {
            return NGX_CONF_ERROR;
        }

        dst2src = ngx_pcalloc(cf->pool, 256);
        if (dst2src == NULL) {
            return NGX_CONF_ERROR;
        }

        pp = (u_char **) &table->dst2src[0];
        pp[0] = dst2src;

        for (i = 0; i < 128; i++) {
            p = &table->src2dst[i * NGX_UTF_LEN];
            p[0] = '\1';
            p[1] = (u_char) i;
            dst2src[i] = (u_char) i;
        }

        for (/* void */; i < 256; i++) {
            p = &table->src2dst[i * NGX_UTF_LEN];
            p[0] = '\1';
            p[1] = '?';
        }

    } else {
        table->src2dst = ngx_palloc(cf->pool, 256);
        if (table->src2dst == NULL) {
            return NGX_CONF_ERROR;
        }

        table->dst2src = ngx_palloc(cf->pool, 256);
        if (table->dst2src == NULL) {
            return NGX_CONF_ERROR;
        }

        for (i = 0; i < 128; i++) {
            table->src2dst[i] = (u_char) i;
            table->dst2src[i] = (u_char) i;
        }

        for (/* void */; i < 256; i++) {
            table->src2dst[i] = '?';
            table->dst2src[i] = '?';
        }
    }

    charset = mcf->charsets.elts;

    ctx.table = table;
    ctx.charset = &charset[dst];
    ctx.characters = 0;

    pvcf = *cf;
    cf->ctx = &ctx;
    cf->handler = ngx_http_charset_map;
    cf->handler_conf = conf;

    rv = ngx_conf_parse(cf, NULL);

    *cf = pvcf;

    if (ctx.characters) {
        n = ctx.charset->length;
        ctx.charset->length /= ctx.characters;

        if (((n * 10) / ctx.characters) % 10 > 4) {
            ctx.charset->length++;
        }
    }

    return rv;
}